

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils-io.c
# Opt level: O0

_Bool get_tempfile(GError **error)

{
  int iVar1;
  int iVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  int *piVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  FILE *pFVar8;
  FILE *tmp_fh;
  int e;
  int fd;
  GError **error_local;
  
  tmpfile_path = (char *)g_strdup("rifiuti-XXXXXX");
  iVar2 = g_mkstemp(tmpfile_path);
  if (iVar2 == -1) {
    piVar5 = __errno_location();
    iVar2 = *piVar5;
    uVar3 = g_file_error_quark();
    uVar4 = g_file_error_from_errno(iVar2);
    uVar6 = gettext("Can not create temp file: %s");
    uVar7 = g_strerror(iVar2);
    g_set_error(error,uVar3,uVar4,uVar6,uVar7);
    error_local._7_1_ = false;
  }
  else {
    pFVar8 = fdopen(iVar2,"wb");
    if (pFVar8 == (FILE *)0x0) {
      piVar5 = __errno_location();
      iVar1 = *piVar5;
      uVar3 = g_file_error_quark();
      uVar4 = g_file_error_from_errno(iVar1);
      uVar6 = gettext("Can not open temp file: %s");
      uVar7 = g_strerror(iVar1);
      g_set_error(error,uVar3,uVar4,uVar6,uVar7);
      g_close(iVar2,0);
      error_local._7_1_ = false;
    }
    else {
      prev_fh = out_fh;
      error_local._7_1_ = true;
      out_fh = (FILE *)pFVar8;
    }
  }
  return error_local._7_1_;
}

Assistant:

bool
get_tempfile    (GError   **error)
{
    int     fd, e = 0;
    FILE   *tmp_fh;

    // segfaults if string is pre-allocated in stack
    tmpfile_path = g_strdup ("rifiuti-XXXXXX");

    if (-1 == (fd = g_mkstemp(tmpfile_path))) {
        e = errno;
        g_set_error (error, G_FILE_ERROR, g_file_error_from_errno(e),
            _("Can not create temp file: %s"), g_strerror(e));
        return false;
    }

    if (NULL == (tmp_fh = fdopen (fd, "wb"))) {
        e = errno;
        g_set_error (error, G_FILE_ERROR, g_file_error_from_errno(e),
            _("Can not open temp file: %s"), g_strerror(e));
        g_close (fd, NULL);
        return false;
    }

    prev_fh = out_fh;
    out_fh  = tmp_fh;

    return true;
}